

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mgm.c
# Opt level: O3

int main(void)

{
  uchar *key;
  uchar *nonce;
  size_t nlen;
  uchar *aad;
  size_t alen;
  uchar *ptext;
  size_t plen;
  uchar *exp_ctext;
  uchar *exp_tag;
  bool bVar1;
  uint uVar2;
  EVP_CIPHER *ciph;
  EVP_CIPHER *pEVar3;
  uint uVar4;
  int small;
  char *pcVar5;
  bool bVar6;
  testcase *ptVar7;
  
  uVar4 = 0;
  OPENSSL_init_crypto(0x4c,0);
  ptVar7 = testcases;
  pcVar5 = "kuznyechik-mgm";
  do {
    ciph = EVP_get_cipherbyname(pcVar5);
    pEVar3 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,pcVar5,0);
    if (ciph == (EVP_CIPHER *)0x0) {
      ciph = pEVar3;
    }
    if (ciph == (EVP_CIPHER *)0x0) {
      printf("failed to load %s\n",pcVar5);
      return 1;
    }
    pcVar5 = (char *)EVP_CIPHER_get0_name(ciph);
    small = 0;
    printf("Tests for %s\n",pcVar5);
    key = ptVar7->key;
    nonce = ptVar7->nonce;
    nlen = ptVar7->nonce_len;
    aad = ptVar7->aad;
    alen = ptVar7->aad_len;
    ptext = ptVar7->plaintext;
    plen = ptVar7->ptext_len;
    exp_ctext = ptVar7->expected;
    exp_tag = ptVar7->expected_tag;
    bVar1 = true;
    do {
      bVar6 = bVar1;
      uVar2 = test_block((EVP_CIPHER *)ciph,pcVar5,nonce,nlen,aad,alen,ptext,plen,exp_ctext,exp_tag,
                         key,small);
      uVar4 = uVar4 | uVar2;
      small = 1;
      bVar1 = false;
    } while (bVar6);
    EVP_CIPHER_free(pEVar3);
    pcVar5 = ptVar7[1].sn;
    ptVar7 = ptVar7 + 1;
  } while (pcVar5 != (char *)0x0);
  if (uVar4 == 0) {
    puts("All tests passed!");
    uVar4 = 0;
  }
  else {
    puts("Some tests FAILED!");
  }
  return uVar4;
}

Assistant:

int main(void)
{
    int ret = 0;
    const struct testcase *t;

    OPENSSL_add_all_algorithms_conf();

    for (t = testcases; t->sn; t++) {
        int small;
        const EVP_CIPHER *ciph_eng = EVP_get_cipherbyname(t->sn);
        EVP_CIPHER *ciph_prov = EVP_CIPHER_fetch(NULL, t->sn, NULL);
        const EVP_CIPHER *ciph = ciph_eng ? ciph_eng : ciph_prov;
        const char *name;
        if (!ciph) {
            printf("failed to load %s\n", t->sn);
            return 1;
        }
        name = EVP_CIPHER_name(ciph);

        printf("Tests for %s\n", name);
        for (small = 0; small <= 1; small++)
            ret |= test_block(ciph, name, t->nonce, t->nonce_len,
                              t->aad, t->aad_len, t->plaintext, t->ptext_len,
                              t->expected, t->expected_tag, t->key, small);
        EVP_CIPHER_free(ciph_prov);
    }

    if (ret) {
        printf("Some tests FAILED!\n");
    } else {
        printf("All tests passed!\n");
    }
    return ret;
}